

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

Function * __thiscall
wasm::ModuleUtils::copyFunction(ModuleUtils *this,Function *func,Module *out,Name newName)

{
  _Rb_tree_header *p_Var1;
  Module *pMVar2;
  char *pcVar3;
  char *pcVar4;
  _Head_base<0UL,_wasm::Function_*,_false> __s;
  ModuleUtils *pMVar5;
  Expression *pEVar6;
  Function *pFVar7;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  Module *pMStack_50;
  Name newName_local;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  __single_object ret;
  
  pMStack_50 = out;
  newName_local.super_IString.str._M_len = newName.super_IString.str._M_len;
  newName_local.super_IString.str._M_str = (char *)func;
  __s._M_head_impl = (Function *)operator_new(0x1f8);
  memset(__s._M_head_impl,0,0x1f8);
  wasm::HeapType::HeapType(&(__s._M_head_impl)->type,(Signature)ZEXT816(0));
  (__s._M_head_impl)->profile = Normal;
  ((__s._M_head_impl)->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((__s._M_head_impl)->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((__s._M_head_impl)->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s._M_head_impl)->body = (Expression *)0x0;
  ((__s._M_head_impl)->stackIR)._M_t.
  super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
  .
  super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
  ._M_head_impl = (vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *)0x0;
  ((__s._M_head_impl)->localNames)._M_h._M_buckets =
       &((__s._M_head_impl)->localNames)._M_h._M_single_bucket;
  ((__s._M_head_impl)->localNames)._M_h._M_bucket_count = 1;
  ((__s._M_head_impl)->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((__s._M_head_impl)->localNames)._M_h._M_element_count = 0;
  ((__s._M_head_impl)->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((__s._M_head_impl)->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
  ((__s._M_head_impl)->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ((__s._M_head_impl)->localIndices)._M_h._M_buckets =
       &((__s._M_head_impl)->localIndices)._M_h._M_single_bucket;
  ((__s._M_head_impl)->localIndices)._M_h._M_bucket_count = 1;
  ((__s._M_head_impl)->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((__s._M_head_impl)->localIndices)._M_h._M_element_count = 0;
  ((__s._M_head_impl)->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((__s._M_head_impl)->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  ((__s._M_head_impl)->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ((__s._M_head_impl)->debugLocations)._M_h._M_buckets =
       &((__s._M_head_impl)->debugLocations)._M_h._M_single_bucket;
  ((__s._M_head_impl)->debugLocations)._M_h._M_bucket_count = 1;
  ((__s._M_head_impl)->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((__s._M_head_impl)->debugLocations)._M_h._M_element_count = 0;
  ((__s._M_head_impl)->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((__s._M_head_impl)->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  ((__s._M_head_impl)->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &((__s._M_head_impl)->prologLocation)._M_t._M_impl.super__Rb_tree_header;
  ((__s._M_head_impl)->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  ((__s._M_head_impl)->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  ((__s._M_head_impl)->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  ((__s._M_head_impl)->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  ((__s._M_head_impl)->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &((__s._M_head_impl)->epilogLocation)._M_t._M_impl.super__Rb_tree_header;
  ((__s._M_head_impl)->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  ((__s._M_head_impl)->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  ((__s._M_head_impl)->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  ((__s._M_head_impl)->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  ((__s._M_head_impl)->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ((__s._M_head_impl)->expressionLocations)._M_h._M_buckets =
       &((__s._M_head_impl)->expressionLocations)._M_h._M_single_bucket;
  ((__s._M_head_impl)->expressionLocations)._M_h._M_bucket_count = 1;
  ((__s._M_head_impl)->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((__s._M_head_impl)->expressionLocations)._M_h._M_element_count = 0;
  ((__s._M_head_impl)->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((__s._M_head_impl)->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  ((__s._M_head_impl)->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ((__s._M_head_impl)->delimiterLocations)._M_h._M_buckets =
       &((__s._M_head_impl)->delimiterLocations)._M_h._M_single_bucket;
  ((__s._M_head_impl)->delimiterLocations)._M_h._M_bucket_count = 1;
  ((__s._M_head_impl)->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((__s._M_head_impl)->delimiterLocations)._M_h._M_element_count = 0;
  ((__s._M_head_impl)->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&((__s._M_head_impl)->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
  ((__s._M_head_impl)->funcLocation).declarations = 0;
  ((__s._M_head_impl)->funcLocation).end = 0;
  ((__s._M_head_impl)->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
  ((__s._M_head_impl)->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_38._M_head_impl = __s._M_head_impl;
  pMVar5 = (ModuleUtils *)&pMStack_50;
  if (newName.super_IString.str._M_len == 0) {
    pMVar5 = this;
  }
  pMVar2 = *(Module **)(pMVar5 + 8);
  ((__s._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
       (size_t)*(Module **)pMVar5;
  ((__s._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = (char *)pMVar2;
  ((__s._M_head_impl)->type).id = *(uintptr_t *)(this + 0x38);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
            (&(__s._M_head_impl)->vars,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(this + 0x48));
  pcVar4 = newName_local.super_IString.str._M_str;
  if (__s._M_head_impl != (Function *)this) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&(__s._M_head_impl)->localNames,
               (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(this + 0x70));
    __s._M_head_impl = local_38._M_head_impl;
  }
  if (__s._M_head_impl != (Function *)this) {
    std::
    _Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(__s._M_head_impl)->localIndices,
               (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(this + 0xa8));
    __s._M_head_impl = local_38._M_head_impl;
  }
  if (__s._M_head_impl != (Function *)this) {
    std::
    _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::Function::DebugLocation>,std::allocator<std::pair<wasm::Expression*const,wasm::Function::DebugLocation>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::Function::DebugLocation>,std::allocator<std::pair<wasm::Expression*const,wasm::Function::DebugLocation>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::Function::DebugLocation>,std::allocator<std::pair<wasm::Expression*const,wasm::Function::DebugLocation>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&(__s._M_head_impl)->debugLocations,
               (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(this + 0xe0));
  }
  local_78 = 0;
  uStack_70 = 0;
  local_60 = std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h:72:15)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h:72:15)>
             ::_M_manager;
  pEVar6 = (Expression *)
           wasm::ExpressionManipulator::flexibleCopy(*(undefined8 *)(this + 0x60),pcVar4);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  (local_38._M_head_impl)->body = pEVar6;
  pcVar3 = *(char **)(this + 0x20);
  ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
       *(size_t *)(this + 0x18);
  ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar3;
  pcVar3 = *(char **)(this + 0x30);
  ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
       *(size_t *)(this + 0x28);
  ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar3;
  if (*(long *)(this + 0x68) == 0) {
    pFVar7 = (Function *)wasm::Module::addFunction((unique_ptr *)pcVar4);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_38);
    return pFVar7;
  }
  __assert_fail("!func->stackIR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                ,0x2d,"Function *wasm::ModuleUtils::copyFunction(Function *, Module &, Name)");
}

Assistant:

inline Function*
copyFunction(Function* func, Module& out, Name newName = Name()) {
  auto ret = std::make_unique<Function>();
  ret->name = newName.is() ? newName : func->name;
  ret->type = func->type;
  ret->vars = func->vars;
  ret->localNames = func->localNames;
  ret->localIndices = func->localIndices;
  ret->debugLocations = func->debugLocations;
  ret->body = ExpressionManipulator::copy(func->body, out);
  ret->module = func->module;
  ret->base = func->base;
  // TODO: copy Stack IR
  assert(!func->stackIR);
  return out.addFunction(std::move(ret));
}